

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOpt.cpp
# Opt level: O3

Value * __thiscall
GlobOpt::GetIntConstantValue(GlobOpt *this,int64 intConst,Instr *instr,Opnd *opnd)

{
  Int64ConstantToValueMap *pIVar1;
  Type piVar2;
  Sym *sym;
  code *pcVar3;
  bool bVar4;
  uint uVar5;
  JITTimeFunctionBody *this_00;
  undefined4 *puVar6;
  Value *val;
  Value *pVVar7;
  Type pSVar8;
  uint uVar9;
  long local_48;
  int64 symStoreIntConstantValue;
  Instr *local_38;
  
  local_38 = instr;
  this_00 = JITTimeWorkItem::GetJITFunctionBody(instr->m_func->m_workItem);
  bVar4 = JITTimeFunctionBody::IsWasmFunction(this_00);
  if (!bVar4) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar6 = 1;
    bVar4 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOpt.cpp"
                       ,0x10a6,"(instr->m_func->GetJITFunctionBody()->IsWasmFunction())",
                       "instr->m_func->GetJITFunctionBody()->IsWasmFunction()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar6 = 0;
  }
  pIVar1 = this->int64ConstantToValueMap;
  piVar2 = pIVar1->buckets;
  uVar5 = 0;
  symStoreIntConstantValue = (int64)opnd;
  if (piVar2 != (Type)0x0) {
    uVar5 = JsUtil::
            BaseDictionary<long,_Value_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
            ::GetBucket((int)intConst * 2 + 1,pIVar1->bucketCount,pIVar1->modFunctionIndex);
    uVar9 = piVar2[uVar5];
    uVar5 = 0;
    if (-1 < (int)uVar9) {
      pSVar8 = pIVar1->entries;
      uVar5 = 0;
      do {
        if (pSVar8[uVar9].
            super_DefaultHashedEntry<long,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>.
            super_KeyValueEntry<long,_Value_*>.
            super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Value_*>_>
            .super_KeyValueEntryDataLayout2<long,_Value_*>.key == intConst) {
          if (pIVar1->stats != (DictionaryStats *)0x0) {
            DictionaryStats::Lookup(pIVar1->stats,uVar5);
            pSVar8 = pIVar1->entries;
          }
          pVVar7 = pSVar8[uVar9].
                   super_DefaultHashedEntry<long,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                   .super_KeyValueEntry<long,_Value_*>.
                   super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Value_*>_>
                   .super_KeyValueEntryDataLayout2<long,_Value_*>.value;
          if ((((pVVar7 == (Value *)0x0) || (sym = pVVar7->valueInfo->symStore, sym == (Sym *)0x0))
              || (bVar4 = GlobOptBlockData::IsLive(&this->currentBlock->globOptData,sym), !bVar4))
             || (((val = GlobOptBlockData::FindValue(&this->currentBlock->globOptData,sym),
                  val == (Value *)0x0 || (val->valueNumber != pVVar7->valueNumber)) ||
                 ((bVar4 = ValueInfo::TryGetInt64ConstantValue(val->valueInfo,&local_48,false),
                  !bVar4 || (local_48 != intConst)))))) goto LAB_0044fa86;
          goto LAB_0044fa98;
        }
        uVar5 = uVar5 + 1;
        uVar9 = pSVar8[uVar9].
                super_DefaultHashedEntry<long,_Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                .super_KeyValueEntry<long,_Value_*>.
                super_ValueEntry<Value_*,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<long,_Value_*>_>
                .super_KeyValueEntryDataLayout2<long,_Value_*>.next;
      } while (-1 < (int)uVar9);
    }
  }
  if (pIVar1->stats != (DictionaryStats *)0x0) {
    DictionaryStats::Lookup(pIVar1->stats,uVar5);
  }
LAB_0044fa86:
  val = NewInt64ConstantValue(this,intConst,local_38);
LAB_0044fa98:
  pVVar7 = GlobOptBlockData::InsertNewValue
                     (&this->currentBlock->globOptData,val,(Opnd *)symStoreIntConstantValue);
  return pVVar7;
}

Assistant:

Value *
GlobOpt::GetIntConstantValue(const int64 intConst, IR::Instr * instr, IR::Opnd *const opnd)
{
    Assert(instr->m_func->GetJITFunctionBody()->IsWasmFunction());

    Value *value = nullptr;
    Value *const cachedValue = this->int64ConstantToValueMap->Lookup(intConst, nullptr);

    if (cachedValue)
    {
        // The cached value could be from a different block since this is a global (as opposed to a per-block) cache. Since
        // values are cloned for each block, we can't use the same value object. We also can't have two values with the same
        // number in one block, so we can't simply copy the cached value either. And finally, there is no deterministic and fast
        // way to determine if a value with the same value number exists for this block. So the best we can do with a global
        // cache is to check the sym-store's value in the current block to see if it has a value with the same number.
        // Otherwise, we have to create a new value with a new value number.
        Sym *const symStore = cachedValue->GetValueInfo()->GetSymStore();
        if (symStore && this->currentBlock->globOptData.IsLive(symStore))
        {

            Value *const symStoreValue = this->currentBlock->globOptData.FindValue(symStore);
            int64 symStoreIntConstantValue;
            if (symStoreValue &&
                symStoreValue->GetValueNumber() == cachedValue->GetValueNumber() &&
                symStoreValue->GetValueInfo()->TryGetInt64ConstantValue(&symStoreIntConstantValue, false) &&
                symStoreIntConstantValue == intConst)
            {
                value = symStoreValue;
            }
        }
    }

    if (!value)
    {
        value = NewInt64ConstantValue(intConst, instr);
    }

    return this->currentBlock->globOptData.InsertNewValue(value, opnd);
}